

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O1

void __thiscall
jhu::thrax::AlignmentTests_Sort_Test::~AlignmentTests_Sort_Test(AlignmentTests_Sort_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AlignmentTests, Sort) {
  auto a = readAlignment("3-2 0-0");
  ASSERT_EQ(2, a.size());
  EXPECT_EQ(0, a.front().src);
  EXPECT_EQ(0, a.front().tgt);
  EXPECT_EQ(3, a.back().src);
  EXPECT_EQ(2, a.back().tgt);

}